

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

char * TextSubtext(char *text,int position,int length)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  lVar4 = 0;
  if ((text != (char *)0x0) && (lVar4 = 0, *text != '\0')) {
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (text[lVar1] != '\0');
  }
  uVar3 = (uint)lVar4;
  uVar2 = 0;
  if (position < (int)uVar3) {
    uVar2 = length;
  }
  if ((int)uVar3 <= (int)uVar2) {
    uVar2 = uVar3;
  }
  if (0 < (int)uVar2) {
    iVar5 = uVar3 - 1;
    if (position < (int)uVar3) {
      iVar5 = position;
    }
    uVar6 = 0;
    do {
      TextSubtext::buffer[uVar6] = text[uVar6 + (long)iVar5];
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  TextSubtext::buffer[(int)uVar2] = '\0';
  return TextSubtext::buffer;
}

Assistant:

const char *TextSubtext(const char *text, int position, int length)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    int textLength = TextLength(text);

    if (position >= textLength)
    {
        position = textLength - 1;
        length = 0;
    }

    if (length >= textLength) length = textLength;

    for (int c = 0 ; c < length ; c++)
    {
        *(buffer + c) = *(text + position);
        text++;
    }

    *(buffer + length) = '\0';

    return buffer;
}